

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

void duckdb::DecimalRoundPositivePrecisionFunction<short,duckdb::NumericHelper>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  short sVar1;
  ulong count;
  short *psVar2;
  short *psVar3;
  unsigned_long *puVar4;
  data_ptr_t pdVar5;
  ulong uVar6;
  data_ptr_t pdVar7;
  byte bVar8;
  short sVar9;
  BoundFunctionExpression *pBVar10;
  pointer pFVar11;
  const_reference this;
  pointer pEVar12;
  reference vector;
  ulong uVar13;
  idx_t iVar14;
  short sVar15;
  idx_t i_2;
  ulong uVar16;
  ulong uVar17;
  idx_t entry_idx;
  ulong uVar18;
  ulong uVar19;
  idx_t i_1;
  idx_t row_idx;
  UnifiedVectorFormat local_78;
  
  pBVar10 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  pFVar11 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->(&pBVar10->bind_info);
  this = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
         ::get<true>(&pBVar10->children,0);
  pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(this);
  bVar8 = DecimalType::GetScale(&pEVar12->return_type);
  sVar1 = *(short *)(NumericHelper::POWERS_OF_TEN +
                    ((ulong)bVar8 - (long)*(int *)&pFVar11[1]._vptr_FunctionData) * 8);
  sVar9 = sVar1 / 2;
  vector = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
  count = input->count;
  if (vector->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar7 = result->data;
    pdVar5 = vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      for (uVar16 = 0; count != uVar16; uVar16 = uVar16 + 1) {
        sVar15 = sVar9;
        if (*(short *)(pdVar5 + uVar16 * 2) < 0) {
          sVar15 = -sVar9;
        }
        *(short *)(pdVar7 + uVar16 * 2) = (short)(sVar15 + *(short *)(pdVar5 + uVar16 * 2)) / sVar1;
      }
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,
                 &(vector->validity).super_TemplatedValidityMask<unsigned_long>);
      puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      uVar16 = 0;
      for (uVar18 = 0; uVar18 != count + 0x3f >> 6; uVar18 = uVar18 + 1) {
        if (puVar4 == (unsigned_long *)0x0) {
          uVar19 = uVar16 + 0x40;
          if (count <= uVar16 + 0x40) {
            uVar19 = count;
          }
LAB_01d1f8d7:
          for (; uVar13 = uVar16, uVar16 < uVar19; uVar16 = uVar16 + 1) {
            sVar15 = sVar9;
            if (*(short *)(pdVar5 + uVar16 * 2) < 0) {
              sVar15 = -sVar9;
            }
            *(short *)(pdVar7 + uVar16 * 2) =
                 (short)(sVar15 + *(short *)(pdVar5 + uVar16 * 2)) / sVar1;
          }
        }
        else {
          uVar6 = puVar4[uVar18];
          uVar19 = uVar16 + 0x40;
          if (count <= uVar16 + 0x40) {
            uVar19 = count;
          }
          if (uVar6 == 0xffffffffffffffff) goto LAB_01d1f8d7;
          uVar13 = uVar19;
          if (uVar6 != 0) {
            for (uVar17 = 0; uVar13 = uVar16 + uVar17, uVar16 + uVar17 < uVar19; uVar17 = uVar17 + 1
                ) {
              if ((uVar6 >> (uVar17 & 0x3f) & 1) != 0) {
                sVar15 = sVar9;
                if (*(short *)(pdVar5 + uVar17 * 2 + uVar16 * 2) < 0) {
                  sVar15 = -sVar9;
                }
                *(short *)(pdVar7 + uVar17 * 2 + uVar16 * 2) =
                     (short)(sVar15 + *(short *)(pdVar5 + uVar17 * 2 + uVar16 * 2)) / sVar1;
              }
            }
          }
        }
        uVar16 = uVar13;
      }
    }
  }
  else if (vector->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    psVar2 = (short *)result->data;
    psVar3 = (short *)vector->data;
    puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
      return;
    }
    ConstantVector::SetNull(result,false);
    sVar15 = -sVar9;
    if (-1 < *psVar3) {
      sVar15 = sVar9;
    }
    *psVar2 = (short)(sVar15 + *psVar3) / sVar1;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(vector,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar7 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      for (uVar16 = 0; count != uVar16; uVar16 = uVar16 + 1) {
        uVar18 = uVar16;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          uVar18 = (ulong)(local_78.sel)->sel_vector[uVar16];
        }
        sVar15 = sVar9;
        if (*(short *)(local_78.data + uVar18 * 2) < 0) {
          sVar15 = -sVar9;
        }
        *(short *)(pdVar7 + uVar16 * 2) =
             (short)(sVar15 + *(short *)(local_78.data + uVar18 * 2)) / sVar1;
      }
    }
    else {
      for (row_idx = 0; count != row_idx; row_idx = row_idx + 1) {
        iVar14 = row_idx;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          iVar14 = (idx_t)(local_78.sel)->sel_vector[row_idx];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar14 >> 6]
             >> (iVar14 & 0x3f) & 1) == 0) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
        }
        else {
          sVar15 = sVar9;
          if (*(short *)(local_78.data + iVar14 * 2) < 0) {
            sVar15 = -sVar9;
          }
          *(short *)(pdVar7 + row_idx * 2) =
               (short)(sVar15 + *(short *)(local_78.data + iVar14 * 2)) / sVar1;
        }
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  }
  return;
}

Assistant:

static void DecimalRoundPositivePrecisionFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RoundPrecisionFunctionData>();
	auto source_scale = DecimalType::GetScale(func_expr.children[0]->return_type);
	T power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[source_scale - info.target_scale]);
	T addition = power_of_ten / 2;
	UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
		if (input < 0) {
			input -= addition;
		} else {
			input += addition;
		}
		return UnsafeNumericCast<T>(input / power_of_ten);
	});
}